

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal.cpp
# Opt level: O0

void unodb::detail::dump_byte(ostream *os,byte byte)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  undefined8 uVar4;
  void *this;
  byte byte_local;
  ostream *os_local;
  
  poVar3 = std::operator<<(os,' ');
  uVar4 = std::ostream::operator<<(poVar3,std::hex);
  _Var1 = std::setfill<char>('0');
  poVar3 = std::operator<<(uVar4,_Var1._M_c);
  _Var2 = std::setw(2);
  poVar3 = std::operator<<(poVar3,_Var2);
  this = (void *)std::ostream::operator<<(poVar3,(uint)byte);
  std::ostream::operator<<(this,std::dec);
  return;
}

Assistant:

[[gnu::cold]] UNODB_DETAIL_NOINLINE void dump_byte(std::ostream &os,
                                                   std::byte byte) {
  os << ' ' << std::hex << std::setfill('0') << std::setw(2)
     << static_cast<unsigned>(byte) << std::dec;
}